

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O3

bool __thiscall
crnd::crn_unpacker::unpack_dxt5
          (crn_unpacker *this,uint8 **pDst,uint32 row_pitch_in_bytes,uint32 output_width,
          uint32 output_height)

{
  symbol_codec *this_00;
  vector<crnd::crn_unpacker::block_buffer_element> *this_01;
  uint uVar1;
  uint uVar2;
  unsigned_short *puVar3;
  bool bVar4;
  byte bVar5;
  uint32 uVar6;
  uint uVar7;
  uint32 uVar8;
  crn_header *pcVar9;
  uint8 *puVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  uint min_new_capacity;
  block_buffer_element *pbVar14;
  uint32 x;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  uint local_d0;
  uint local_cc;
  
  uVar1 = (this->m_color_endpoints).m_size;
  uVar2 = (this->m_alpha_endpoints).m_size;
  min_new_capacity = output_width + 1 & 0xfffffffe;
  this_01 = &this->m_block_buffer;
  uVar11 = (this->m_block_buffer).m_size;
  if (uVar11 < min_new_capacity) {
    if ((this->m_block_buffer).m_capacity < min_new_capacity) {
      bVar4 = elemental_vector::increase_capacity
                        ((elemental_vector *)this_01,min_new_capacity,uVar11 + 1 == min_new_capacity
                         ,8,(object_mover)0x0);
      if (!bVar4) {
        (this->m_block_buffer).m_alloc_failed = true;
        goto LAB_00114757;
      }
    }
    (this->m_block_buffer).m_size = min_new_capacity;
  }
LAB_00114757:
  pcVar9 = this->m_pHeader;
  if ((pcVar9->m_faces).m_buf[0] != '\0') {
    uVar11 = output_height + 1 & 0xfffffffe;
    this_00 = &this->m_codec;
    uVar13 = 0;
    local_d0 = 0;
    local_cc = 0;
    uVar17 = 0;
    do {
      if (uVar11 != 0) {
        puVar10 = pDst[uVar13];
        uVar12 = 0;
        do {
          if (min_new_capacity != 0) {
            bVar4 = uVar12 < output_height;
            lVar19 = 6;
            lVar18 = 0;
            uVar15 = 0;
            do {
              uVar16 = (uint)uVar17;
              if (((uVar12 | (uint)uVar15) & 1) == 0) {
                uVar6 = symbol_codec::decode(this_00,&this->m_reference_encoding_dm);
                uVar17 = (ulong)uVar6;
                pbVar14 = this_01->m_p + uVar15;
LAB_00114894:
                bVar5 = (byte)uVar17 & 3;
                pbVar14->endpoint_reference = (ushort)((byte)(uVar17 >> 2) & 3);
                uVar16 = (uint)(byte)((byte)uVar17 >> 4);
              }
              else {
                pbVar14 = (block_buffer_element *)((long)this_01->m_p + lVar19 + -6);
                if ((uVar12 & 1) == 0) goto LAB_00114894;
                bVar5 = (byte)this_01->m_p[uVar15].endpoint_reference;
              }
              if (bVar5 == 1) {
                pbVar14->color_endpoint_index = (uint16)local_d0;
                pbVar14->alpha0_endpoint_index = (uint16)local_cc;
              }
              else if (bVar5 == 0) {
                uVar6 = symbol_codec::decode(this_00,this->m_endpoint_delta_dm);
                uVar7 = 0;
                if (uVar1 <= uVar6 + local_d0) {
                  uVar7 = uVar1;
                }
                local_d0 = (uVar6 + local_d0) - uVar7;
                pbVar14->color_endpoint_index = (uint16)local_d0;
                uVar6 = symbol_codec::decode(this_00,this->m_endpoint_delta_dm + 1);
                uVar7 = 0;
                if (uVar2 <= uVar6 + local_cc) {
                  uVar7 = uVar2;
                }
                local_cc = (uVar6 + local_cc) - uVar7;
                pbVar14->alpha0_endpoint_index = (uint16)local_cc;
              }
              else {
                local_d0 = (uint)pbVar14->color_endpoint_index;
                local_cc = (uint)pbVar14->alpha0_endpoint_index;
              }
              bVar4 = (bool)(bVar4 & uVar15 < output_width);
              uVar6 = symbol_codec::decode(this_00,this->m_selector_delta_dm);
              uVar8 = symbol_codec::decode(this_00,this->m_selector_delta_dm + 1);
              if (bVar4) {
                puVar3 = (this->m_alpha_selectors).m_p;
                *(uint *)(puVar10 + lVar19 * 2 + -0xc) =
                     CONCAT22(puVar3[uVar8 * 3],(this->m_alpha_endpoints).m_p[local_cc]);
                *(undefined4 *)(puVar10 + lVar19 * 2 + -8) =
                     *(undefined4 *)(puVar3 + (ulong)(uVar8 * 3) + 1);
                *(uint *)(puVar10 + lVar19 * 2 + -4) = (this->m_color_endpoints).m_p[local_d0];
                *(uint *)(puVar10 + lVar19 * 2) = (this->m_color_selectors).m_p[uVar6];
              }
              uVar15 = uVar15 + 1;
              lVar19 = lVar19 + 8;
              lVar18 = lVar18 + -0x10;
              uVar17 = (ulong)uVar16;
            } while (min_new_capacity != uVar15);
            puVar10 = puVar10 + -lVar18;
          }
          uVar12 = uVar12 + 1;
          puVar10 = puVar10 + (long)(int)((row_pitch_in_bytes >> 2) + min_new_capacity * -4) * 4;
        } while (uVar12 != uVar11);
        pcVar9 = this->m_pHeader;
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 < (pcVar9->m_faces).m_buf[0]);
  }
  return true;
}

Assistant:

bool unpack_dxt5(uint8** pDst, uint32 row_pitch_in_bytes, uint32 output_width, uint32 output_height)
        {
            const uint32 num_color_endpoints = m_color_endpoints.size();
            const uint32 num_alpha_endpoints = m_alpha_endpoints.size();
            const uint32 width = (output_width + 1) & ~1;
            const uint32 height = (output_height + 1) & ~1;
            const int32 delta_pitch_in_dwords = (row_pitch_in_bytes >> 2) - (width << 2);

            if (m_block_buffer.size() < width)
                m_block_buffer.resize(width);

            uint32 color_endpoint_index = 0;
            uint32 alpha0_endpoint_index = 0;
            uint8 reference_group = 0;

            for (uint32 f = 0; f < m_pHeader->m_faces; f++)
            {
                uint32* pData = (uint32*)pDst[f];
                for (uint32 y = 0; y < height; y++, pData += delta_pitch_in_dwords)
                {
                    bool visible = y < output_height;
                    for (uint32 x = 0; x < width; x++, pData += 4)
                    {
                        visible = visible && x < output_width;
                        if (!(y & 1) && !(x & 1))
                            reference_group = m_codec.decode(m_reference_encoding_dm);
                        block_buffer_element& buffer = m_block_buffer[x];
                        uint8 endpoint_reference;
                        if (y & 1)
                        {
                            endpoint_reference = buffer.endpoint_reference;
                        }
                        else
                        {
                            endpoint_reference = reference_group & 3;
                            reference_group >>= 2;
                            buffer.endpoint_reference = reference_group & 3;
                            reference_group >>= 2;
                        }
                        if (!endpoint_reference)
                        {
                            color_endpoint_index += m_codec.decode(m_endpoint_delta_dm[0]);
                            if (color_endpoint_index >= num_color_endpoints)
                                color_endpoint_index -= num_color_endpoints;
                            buffer.color_endpoint_index = color_endpoint_index;
                            alpha0_endpoint_index += m_codec.decode(m_endpoint_delta_dm[1]);
                            if (alpha0_endpoint_index >= num_alpha_endpoints)
                                alpha0_endpoint_index -= num_alpha_endpoints;
                            buffer.alpha0_endpoint_index = alpha0_endpoint_index;
                        }
                        else if (endpoint_reference == 1)
                        {
                            buffer.color_endpoint_index = color_endpoint_index;
                            buffer.alpha0_endpoint_index = alpha0_endpoint_index;
                        }
                        else
                        {
                            color_endpoint_index = buffer.color_endpoint_index;
                            alpha0_endpoint_index = buffer.alpha0_endpoint_index;
                        }
                        uint32 color_selector_index = m_codec.decode(m_selector_delta_dm[0]);
                        uint32 alpha0_selector_index = m_codec.decode(m_selector_delta_dm[1]);
                        if (visible)
                        {
                            const uint16* pAlpha0_selectors = &m_alpha_selectors[alpha0_selector_index * 3];
                            pData[0] = m_alpha_endpoints[alpha0_endpoint_index] | (pAlpha0_selectors[0] << 16);
                            pData[1] = pAlpha0_selectors[1] | (pAlpha0_selectors[2] << 16);
                            pData[2] = m_color_endpoints[color_endpoint_index];
                            pData[3] = m_color_selectors[color_selector_index];
                        }
                    }
                }
            }
            return true;
        }